

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_levels_dec_utils.c
# Opt level: O0

void VFilter(SmoothParams *p)

{
  int iVar1;
  uint8_t *puVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  uint16_t uVar6;
  uint16_t new_value;
  int x;
  uint16_t sum;
  uint16_t *out;
  uint16_t *top;
  uint16_t *cur;
  int w;
  uint8_t *src;
  SmoothParams *p_local;
  
  puVar2 = p->src_;
  iVar1 = p->width_;
  puVar3 = p->cur_;
  puVar4 = p->top_;
  puVar5 = p->end_;
  sum = 0;
  for (x = 0; x < iVar1; x = x + 1) {
    sum = sum + puVar2[x];
    uVar6 = puVar4[x] + sum;
    puVar5[x] = uVar6 - puVar3[x];
    puVar3[x] = uVar6;
  }
  p->top_ = p->cur_;
  p->cur_ = p->cur_ + iVar1;
  if (p->cur_ == p->end_) {
    p->cur_ = p->start_;
  }
  if ((-1 < p->row_) && (p->row_ < p->height_ + -1)) {
    p->src_ = p->src_ + p->stride_;
  }
  return;
}

Assistant:

static void VFilter(SmoothParams* const p) {
  const uint8_t* src = p->src_;
  const int w = p->width_;
  uint16_t* const cur = p->cur_;
  const uint16_t* const top = p->top_;
  uint16_t* const out = p->end_;
  uint16_t sum = 0;               // all arithmetic is modulo 16bit
  int x;

  for (x = 0; x < w; ++x) {
    uint16_t new_value;
    sum += src[x];
    new_value = top[x] + sum;
    out[x] = new_value - cur[x];  // vertical sum of 'r' pixels.
    cur[x] = new_value;
  }
  // move input pointers one row down
  p->top_ = p->cur_;
  p->cur_ += w;
  if (p->cur_ == p->end_) p->cur_ = p->start_;  // roll-over
  // We replicate edges, as it's somewhat easier as a boundary condition.
  // That's why we don't update the 'src' pointer on top/bottom area:
  if (p->row_ >= 0 && p->row_ < p->height_ - 1) {
    p->src_ += p->stride_;
  }
}